

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heaplist.h
# Opt level: O0

void __thiscall HeapList::AddHeap(HeapList *this,int key)

{
  CBinaryHeap<CLeftistNode> *this_00;
  CBinomialHeap *this_01;
  CBinaryHeap<CSkewNode> *this_02;
  CFoolHeap *this_03;
  CFoolHeap *local_48;
  CBinaryHeap<CSkewNode> *local_40;
  CBinomialHeap *local_38 [3];
  CBinaryHeap<CLeftistNode> *local_20;
  int local_14;
  HeapList *pHStack_10;
  int key_local;
  HeapList *this_local;
  
  local_14 = key;
  pHStack_10 = this;
  switch(this->TYPE) {
  case Binomial:
    this_01 = (CBinomialHeap *)operator_new(0x10);
    CBinomialHeap::CBinomialHeap(this_01,local_14);
    local_38[0] = this_01;
    std::vector<IHeap_*,_std::allocator<IHeap_*>_>::push_back(&this->list_,(value_type *)local_38);
    break;
  case Leftist:
    this_00 = (CBinaryHeap<CLeftistNode> *)operator_new(0x10);
    CBinaryHeap<CLeftistNode>::CBinaryHeap(this_00,local_14);
    local_20 = this_00;
    std::vector<IHeap_*,_std::allocator<IHeap_*>_>::push_back(&this->list_,(value_type *)&local_20);
    break;
  case Skew:
    this_02 = (CBinaryHeap<CSkewNode> *)operator_new(0x10);
    CBinaryHeap<CSkewNode>::CBinaryHeap(this_02,local_14);
    local_40 = this_02;
    std::vector<IHeap_*,_std::allocator<IHeap_*>_>::push_back(&this->list_,(value_type *)&local_40);
    break;
  case Fool:
    this_03 = (CFoolHeap *)operator_new(0x20);
    CFoolHeap::CFoolHeap(this_03,local_14);
    local_48 = this_03;
    std::vector<IHeap_*,_std::allocator<IHeap_*>_>::push_back(&this->list_,(value_type *)&local_48);
  }
  return;
}

Assistant:

void AddHeap(int key) {

        switch(TYPE) {
            case Leftist: {
                list_.push_back(new CLeftistHeap(key));
            } break;
            case Binomial: {
                list_.push_back(new CBinomialHeap(key));
            } break;

            case Skew: {
                list_.push_back(new CSkewHeap(key));
            } break;
            case Fool: {
                list_.push_back(new CFoolHeap(key));
            } break;
        }
    }